

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heterogeneous_queue_basic_tests.cpp
# Opt level: O3

void density_tests::
     NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
     ::
     dynamic_push_3<density_tests::SingleDerivedNonPoly,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>>
               (lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                *i_queue)

{
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  SingleDerivedNonPoly move_source;
  SingleDerivedNonPoly copy_source;
  runtime_type local_b0;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  InstanceCounted local_60 [8];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  InstanceCounted local_10 [8];
  
  local_b0.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::SingleDerivedNonPoly>
       ::s_table;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::dyn_push(i_queue,&local_b0);
  local_58._0_4_ = 0x23;
  InstanceCounted::new_instance((InstanceCounted *)(local_58 + 4));
  local_50._M_p = (pointer)&local_40;
  local_40._M_allocated_capacity._0_4_ = 0x6c6c6548;
  local_40._M_allocated_capacity._4_2_ = 0x206f;
  local_48 = 6;
  local_40._M_local_buf[6] = '\0';
  local_30._M_p = (pointer)&local_20;
  local_20._M_allocated_capacity._0_4_ = 0x6c726f77;
  local_20._M_allocated_capacity._4_3_ = 0x212164;
  local_28 = 7;
  local_20._M_local_buf[7] = '\0';
  InstanceCounted::new_instance(local_10);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::dyn_push_copy(i_queue,&local_b0,local_58);
  local_a8._0_4_ = 0x23;
  InstanceCounted::new_instance((InstanceCounted *)(local_a8 + 4));
  local_a0._M_p = (pointer)&local_90;
  local_90._M_allocated_capacity._0_4_ = 0x6c6c6548;
  local_90._M_allocated_capacity._4_2_ = 0x206f;
  local_98 = 6;
  local_90._M_local_buf[6] = '\0';
  local_80._M_p = (pointer)&local_70;
  local_70._M_allocated_capacity._0_4_ = 0x6c726f77;
  local_70._M_allocated_capacity._4_3_ = 0x212164;
  local_78 = 7;
  local_70._M_local_buf[7] = '\0';
  InstanceCounted::new_instance(local_60);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::dyn_push_move(i_queue,&local_b0,local_a8);
  SingleDerivedNonPoly::~SingleDerivedNonPoly((SingleDerivedNonPoly *)local_a8);
  SingleDerivedNonPoly::~SingleDerivedNonPoly((SingleDerivedNonPoly *)local_58);
  return;
}

Assistant:

static void dynamic_push_3(QUEUE & i_queue)
        {
            auto const type = QUEUE::runtime_type::template make<ELEMENT>();

            i_queue.dyn_push(type);

            ELEMENT copy_source;
            i_queue.dyn_push_copy(type, &copy_source);

            ELEMENT move_source;
            i_queue.dyn_push_move(type, &move_source);
        }